

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpile_to_js.c
# Opt level: O0

void to_js_print_translation_unit_tree
               (FILE *out,AST_Translation_Unit *translation_unit,Program *program)

{
  AST *hold;
  Queue_Node *it;
  Program *program_local;
  AST_Translation_Unit *translation_unit_local;
  FILE *out_local;
  
  for (hold = (AST *)(translation_unit->components).first; hold != (AST *)0x0;
      hold = *(AST **)(hold + 2)) {
    to_js_print_ast(out,*(AST **)hold,program);
    fprintf((FILE *)out,";\n");
  }
  return;
}

Assistant:

void to_js_print_translation_unit_tree(FILE* out,struct AST_Translation_Unit *translation_unit,struct Program *program)
{
	struct Queue_Node *it;	
	struct AST* hold;
	for(it=translation_unit->components.first;it!=NULL;it=it->prev)
	{
		hold=(struct AST*)(it->data);
		to_js_print_ast(out,hold,program);

		fprintf(out,";\n");
	}
}